

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_spawns.cxx
# Opt level: O0

void __thiscall xray_re::xr_spawn_object::save(xr_spawn_object *this,xr_writer *w)

{
  xr_scene *this_00;
  string *s;
  size_t value;
  undefined1 local_1068 [8];
  xr_packet packet;
  allocator<xray_re::xr_custom_object_*> local_39;
  undefined1 local_38 [8];
  xr_custom_object_vec objects;
  uint16_t version;
  xr_writer *w_local;
  xr_spawn_object *this_local;
  
  xr_custom_object::save(&this->super_xr_custom_object,w);
  objects.
  super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._6_2_ = 0x14;
  xr_writer::w_chunk<unsigned_short>
            (w,0xe411,(unsigned_short *)
                      ((long)&objects.
                              super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  if (this->m_attached_object != (xr_custom_object *)0x0) {
    std::allocator<xray_re::xr_custom_object_*>::allocator(&local_39);
    std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::vector
              ((vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_> *)
               local_38,1,&this->m_attached_object,&local_39);
    std::allocator<xray_re::xr_custom_object_*>::~allocator(&local_39);
    this_00 = xr_custom_object::scene(&this->super_xr_custom_object);
    xr_scene::save_objects(this_00,w,0xe421,(xr_custom_object_vec *)local_38);
    std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::~vector
              ((vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_> *)
               local_38);
  }
  if (*(int *)&(this->super_xr_custom_object).field_0x6c == 2) {
    if ((this->field_1).m_entity == (cse_abstract *)0x0) {
      __assert_fail("m_entity",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_spawns.cxx"
                    ,0x73,"virtual void xray_re::xr_spawn_object::save(xr_writer &) const");
    }
    s = cse_abstract::name_abi_cxx11_((this->field_1).m_entity);
    xr_writer::w_chunk(w,0xe419,s);
    xr_writer::open_chunk(w,0xe420);
    xr_packet::xr_packet((xr_packet *)local_1068);
    cse_abstract::spawn_write((this->field_1).m_entity,(xr_packet *)local_1068,true);
    value = xr_packet::w_tell((xr_packet *)local_1068);
    xr_writer::w_size_u32(w,value);
    xr_writer::w_packet(w,(xr_packet *)local_1068);
    xr_writer::close_chunk(w);
  }
  else {
    xr_writer::w_chunk<unsigned_int>(w,0xe417,(uint *)&(this->super_xr_custom_object).field_0x6c);
    if (*(int *)&(this->super_xr_custom_object).field_0x6c == 0) {
      xr_writer::open_chunk(w,0xe413);
      xr_writer::w_u8(w,(this->field_1).field_0.m_team);
      xr_writer::w_u8(w,(this->field_1).field_0.m_respawn);
      xr_writer::w_u8(w,(this->field_1).field_0.m_game);
      xr_writer::w_u8(w,'\0');
      xr_writer::close_chunk(w);
    }
    else {
      if (*(int *)&(this->super_xr_custom_object).field_0x6c != 1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_spawns.cxx"
                      ,0x91,"virtual void xray_re::xr_spawn_object::save(xr_writer &) const");
      }
      xr_writer::open_chunk(w,0xe422);
      xr_writer::w_float(w,(this->field_1).field_1.m_radius);
      xr_writer::w_float(w,(this->field_1).field_1.m_power);
      xr_writer::w_float(w,(this->field_1).field_1.m_view_distance);
      xr_writer::w_u32(w,(this->field_1).field_1.m_fog_color);
      xr_writer::w_float(w,(this->field_1).field_1.m_fog_density);
      xr_writer::w_u32(w,(this->field_1).field_1.m_ambient_color);
      xr_writer::w_u32(w,(this->field_1).field_1.m_sky_color);
      xr_writer::close_chunk(w);
      xr_writer::w_chunk<unsigned_int>(w,0xe423,&(this->field_1).field_1.m_hemi_color);
    }
  }
  return;
}

Assistant:

void xr_spawn_object::save(xr_writer& w) const
{
	xr_custom_object::save(w);

	uint16_t version = SPAWNPOINT_VERSION;
	w.w_chunk<uint16_t>(SPAWNPOINT_CHUNK_VERSION, version);

	if (m_attached_object) {
		xr_custom_object_vec objects(1, m_attached_object);
		scene().save_objects(w, SPAWNPOINT_CHUNK_ATTACHED_OBJECT, objects);
	}
	if (m_type == SPAWNPOINT_TYPE_ENTITY) {
		xr_assert(m_entity);
		w.w_chunk(SPAWNPOINT_CHUNK_SECTION, m_entity->name());

		w.open_chunk(SPAWNPOINT_CHUNK_SPAWNDATA);
		xr_packet packet;
		m_entity->spawn_write(packet, true);
		w.w_size_u32(packet.w_tell());
		w.w_packet(packet);
		w.close_chunk();
	} else {
		w.w_chunk(SPAWNPOINT_CHUNK_TYPE, m_type);
		if (m_type == SPAWNPOINT_TYPE_RPOINT) {
			w.open_chunk(SPAWNPOINT_CHUNK_RPOINT_PARAMS);
			w.w_u8(m_team);
			w.w_u8(m_respawn);
			w.w_u8(m_game);
			w.w_u8(0);
			w.close_chunk();
		} else if (m_type == SPAWNPOINT_TYPE_ENV_MOD) {
			w.open_chunk(SPAWNPOINT_CHUNK_ENV_MOD_PARAMS);
			w.w_float(m_radius);
			w.w_float(m_power);
			w.w_float(m_view_distance);
			w.w_u32(m_fog_color);
			w.w_float(m_fog_density);
			w.w_u32(m_ambient_color);
			w.w_u32(m_sky_color);
			w.close_chunk();
			w.w_chunk<uint32_t>(SPAWNPOINT_CHUNK_ENV_MOD_HEMI, m_hemi_color);
		} else {
			xr_not_expected();
		}
	}
}